

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

Index __thiscall ProblemAloha::composeObservation(ProblemAloha *this,Index status,Index newPacket)

{
  Index IVar1;
  allocator_type local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> splitO;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&splitO,2,&local_39);
  *splitO.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = status;
  splitO.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = newPacket;
  IVar1 = IndexTools::IndividualToJointIndicesStepSize(&splitO,this->_m_stepSizeObservations);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&splitO.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return IVar1;
}

Assistant:

Index ProblemAloha::composeObservation(Index status, Index newPacket) const
{
    vector<Index> splitO(2);
    splitO[0]=status;
    splitO[1]=newPacket;
    return(IndexTools::IndividualToJointIndicesStepSize(splitO,
                                                        _m_stepSizeObservations));
}